

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O2

_Bool borg_test_stuff(void)

{
  _Bool _Var1;
  _Bool _Var2;
  ushort uVar3;
  wchar_t wVar4;
  int iVar5;
  char *pcVar6;
  angband_constants *paVar7;
  keycode_t k;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  borg_item_conflict *pbVar11;
  long lVar12;
  uint local_40;
  uint local_3c;
  
  _Var1 = borg_spell_legal(IDENTIFY_RUNE);
  if (((0x31 < borg.trait[0x1e]) || (_Var2 = borg_spell_legal(IDENTIFY_RUNE), !_Var2)) ||
     (_Var2 = borg_check_rest(borg.c.y,borg.c.x), _Var2)) {
    wVar4 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
    if (L'\x01' < wVar4) {
      return false;
    }
    uVar3 = z_info->pack_size;
    uVar10 = (ulong)uVar3;
    lVar12 = uVar10 * 0x388;
    local_40 = 0xffffffff;
    paVar7 = z_info;
    local_3c = local_40;
    for (; pbVar11 = borg_items, uVar10 < (ulong)uVar3 + (ulong)paVar7->quiver_size + 0xc;
        uVar10 = uVar10 + 1) {
      if ((borg_items->curses[lVar12 + -0x26] != false) &&
         (borg_items->curses[lVar12 + -0x2d] == true)) {
        if (borg_items->curses[lVar12 + -0x22] == false) {
          uVar9 = 0;
        }
        else {
          uVar9 = *(int *)(borg_items->curses + lVar12 + -6) + 150000;
        }
        _Var2 = borg_ego_has_random_power(e_info + borg_items->curses[lVar12 + -0x21]);
        if (_Var2) {
          uVar9 = *(int *)(pbVar11->curses + lVar12 + -6) + 100000;
        }
        _Var2 = borg_item_note_needs_id((borg_item_conflict *)(pbVar11->desc + lVar12));
        if (_Var2) {
          uVar9 = *(int *)(pbVar11->curses + lVar12 + -6) + 20000;
        }
        paVar7 = z_info;
        if ((uVar9 != 0) && ((int)local_3c < (int)uVar9)) {
          local_40 = (uint)uVar10;
          local_3c = uVar9;
        }
      }
      uVar3 = paVar7->pack_size;
      lVar12 = lVar12 + 0x388;
    }
    lVar12 = 0;
    bVar8 = false;
    for (uVar10 = 0; pbVar11 = borg_items, uVar3 = paVar7->pack_size,
        uVar10 < (ulong)paVar7->quiver_size + (ulong)uVar3 + 0xc; uVar10 = uVar10 + 1) {
      if ((borg_items->curses[lVar12 + -0x26] == false) ||
         (borg_items->curses[lVar12 + -0x2d] != true)) goto LAB_0021b166;
      if (borg_items->curses[lVar12 + -0x22] == false) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(int *)(borg_items->curses + lVar12 + -6) + 150000;
      }
      pcVar6 = borg_items->desc;
      _Var2 = borg_item_note_needs_id((borg_item_conflict *)(pcVar6 + lVar12));
      if (_Var2) {
        uVar9 = *(int *)(pbVar11->curses + lVar12 + -6) + 20000;
      }
      else if ((_Var1) || (_Var2 = borg_item_worth_id((borg_item *)(pcVar6 + lVar12)), _Var2)) {
        uVar9 = *(uint *)(pbVar11->curses + lVar12 + -6);
      }
      if (pbVar11->curses[lVar12 + -0x2c] != false) goto switchD_0021b0cb_caseD_1b;
      switch(pbVar11->curses[lVar12 + -0x2a]) {
      case true:
      case true:
        iVar5 = borg.trait[0x6a] * 5000;
        break;
      case true:
      case true:
        iVar5 = borg.trait[0x6a] * 2000;
        break;
      case true:
        iVar5 = borg.trait[0x6a] * 3000;
        break;
      case true:
      case true:
        if (4 < borg.trait[0x6a]) {
          iVar5 = borg.trait[0x6a] * 500;
          break;
        }
      default:
        goto switchD_0021b0cb_caseD_1b;
      case true:
        iVar5 = borg.trait[0x6a] * 10;
      }
      uVar9 = uVar9 + iVar5;
switchD_0021b0cb_caseD_1b:
      bVar8 = (bool)(uVar10 < uVar3 | bVar8);
      if ((uVar9 != 0) && ((int)local_3c < (int)uVar9)) {
        local_40 = (uint)uVar10;
        local_3c = uVar9;
      }
LAB_0021b166:
      lVar12 = lVar12 + 0x388;
      paVar7 = z_info;
    }
    if (-1 < (int)local_40) {
      pbVar11 = borg_items + local_40;
      _Var1 = borg_spell(IDENTIFY_RUNE);
      if ((_Var1) || (_Var1 = borg_read_scroll(sv_scroll_identify), _Var1)) {
        pcVar6 = format("# Identifying %s.",pbVar11);
        borg_note(pcVar6);
        uVar3 = z_info->pack_size;
        if ((local_40 < uVar3) || (uVar3 + 0xc <= local_40)) {
          if (local_40 < uVar3 + 0xc) {
            k = (keycode_t)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[local_40];
          }
          else {
            borg_keypress(0x7c);
            k = (local_40 - z_info->pack_size) + 0x24;
          }
        }
        else {
          if (bVar8) {
            borg_keypress(0x2f);
            uVar3 = z_info->pack_size;
          }
          k = (keycode_t)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)(local_40 - uVar3)]
          ;
        }
        borg_keypress(k);
        borg_keypress(0xe000);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool borg_test_stuff(void)
{
    int  i;
    int  b_i = -1, b_v = -1;
    bool inv_item_needs_id = false;
    bool free_id           = borg_spell_legal(IDENTIFY_RUNE);

    /* don't ID stuff when you can't recover spent spell point immediately */
    if (borg.trait[BI_CURSP] < 50 && borg_spell_legal(IDENTIFY_RUNE)
        && !borg_check_rest(borg.c.y, borg.c.x))
        return false;

    /* No ID if in danger */
    if (borg_danger(borg.c.y, borg.c.x, 1, true, false) > 1)
        return false;

    /* Look for an item to identify (equipment) */
    for (i = INVEN_WIELD; i < QUIVER_END; i++) {
        int        v    = 0;
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;
        if (!item->needs_ident)
            continue;

        /* Preferentially ID egos and artifacts */
        if (item->art_idx)
            v = item->value + 150000L;

        if (borg_ego_has_random_power(&e_info[item->ego_idx])) {
            v = item->value + 100000L;
        }

        /* Prioritize the ID */
        if (borg_item_note_needs_id(item))
            v = item->value + 20000L;

        /* Ignore */
        if (!v)
            continue;

        /* Track the best */
        if (v <= b_v)
            continue;

        /* Track it */
        b_i = i;
        b_v = v;
    }

    /* Look for an item to identify  */
    for (i = 0; i < QUIVER_END; i++) {
        int        v    = 0;
        borg_item *item = &borg_items[i];

        /* Skip empty and ID'd items */
        if (!item->iqty)
            continue;
        if (!item->needs_ident)
            continue;

        if (i < z_info->pack_size)
            inv_item_needs_id = true;

        /* Preferentially ID artifacts */
        if (item->art_idx)
            v = item->value + 150000L;

        /* Identify "good" items */
        if (borg_item_note_needs_id(item))
            v = item->value + 20000L;
        else if (free_id || borg_item_worth_id(item))
            v = item->value;

        /* Hack -- reward "unaware" items */
        if (!item->aware) {
            /* Analyze the type */
            switch (item->tval) {
            case TV_RING:
            case TV_AMULET:
                v += (borg.trait[BI_MAXDEPTH] * 5000L);
                break;

            case TV_ROD:
                v += (borg.trait[BI_MAXDEPTH] * 3000L);
                break;

            case TV_WAND:
            case TV_STAFF:
                v += (borg.trait[BI_MAXDEPTH] * 2000L);
                break;

            case TV_POTION:
            case TV_SCROLL:
                /* Hack -- boring levels */
                if (borg.trait[BI_MAXDEPTH] < 5)
                    break;

                /* Hack -- reward depth */
                v += (borg.trait[BI_MAXDEPTH] * 500L);
                break;

            case TV_FOOD:
                v += (borg.trait[BI_MAXDEPTH] * 10L);
                break;
            }
        }

        /* Ignore */
        if (!v)
            continue;

        /* Track the best */
        if (v <= b_v)
            continue;

        /* Track it */
        b_i = i;
        b_v = v;
    }

    /* Found something */
    if (b_i >= 0) {
        borg_item *item = &borg_items[b_i];

        /* Use an item to identify */
        if (borg_spell(IDENTIFY_RUNE) || borg_read_scroll(sv_scroll_identify)) {
            /* Log -- may be cancelled */
            borg_note(format("# Identifying %s.", item->desc));

            /* Equipment */
            if (b_i >= INVEN_WIELD && b_i < QUIVER_START) {
                if (inv_item_needs_id)
                    borg_keypress('/');

                /* Select the item */
                borg_keypress(all_letters_nohjkl[b_i - INVEN_WIELD]);

            } else if (b_i >= QUIVER_START) {
                /* Select quiver */
                borg_keypress('|');

                /* Select the item */
                borg_keypress(I2D(b_i - QUIVER_START));
            }
            /* Inventory */
            else {
                /* Select the item */
                borg_keypress(all_letters_nohjkl[b_i]);
            }

            borg_keypress(ESCAPE);

            return true;
        }
    }

    /* Nothing to do */
    return false;
}